

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_2d_avx2.h
# Opt level: O1

void convolve_2d_sr_ver_8tap_avx2
               (int16_t *im_block,int32_t w,int32_t h,InterpFilterParams *filter_params_y,
               int32_t subpel_y_q4,uint8_t *dst,int32_t dst_stride)

{
  undefined4 uVar1;
  undefined4 uVar2;
  uint uVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  ulong uVar15;
  int32_t iVar16;
  long lVar17;
  long lVar18;
  undefined1 (*pauVar19) [32];
  long lVar20;
  int16_t *piVar21;
  int16_t *piVar22;
  __m128i d0;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [16];
  undefined1 auVar39 [32];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [16];
  undefined1 auVar54 [32];
  undefined1 auVar55 [64];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 local_3c8 [32];
  undefined1 local_388 [32];
  undefined1 local_368 [32];
  undefined1 local_2f8 [32];
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [32];
  undefined1 local_298 [32];
  undefined1 local_278 [32];
  undefined1 local_238 [32];
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  undefined1 local_1d8 [32];
  undefined1 local_1b8 [32];
  undefined1 local_198 [32];
  undefined1 local_178 [32];
  
  uVar15 = (ulong)((uint)filter_params_y->taps * (subpel_y_q4 & 0xfU));
  piVar21 = filter_params_y->filter_ptr;
  if (w == 2) {
    auVar23._8_8_ = 0;
    auVar23._0_8_ = *(ulong *)im_block;
    auVar24 = vpshufd_avx(auVar23,0x55);
    auVar32._8_8_ = 0;
    auVar32._0_8_ = *(ulong *)(im_block + 4);
    auVar51 = vpshufd_avx(auVar32,0x55);
    auVar45._8_8_ = 0;
    auVar45._0_8_ = *(ulong *)(im_block + 8);
    auVar29 = vpshufd_avx(auVar45,0x55);
    uVar3 = *(uint *)(im_block + 0xc);
    auVar35 = vpunpckldq_avx(auVar24,auVar32);
    auVar36 = vpunpckldq_avx(auVar51,auVar45);
    auVar24 = vpinsrd_avx(auVar29,*(undefined4 *)(im_block + 0xc),1);
    auVar51 = vpunpcklwd_avx(auVar23,auVar35);
    auVar33._8_8_ = 0;
    auVar33._0_8_ = *(ulong *)(im_block + 4);
    auVar29 = vpunpcklwd_avx(auVar33,auVar36);
    uVar1 = *(undefined4 *)(piVar21 + uVar15);
    auVar28._4_4_ = uVar1;
    auVar28._0_4_ = uVar1;
    auVar28._8_4_ = uVar1;
    auVar28._12_4_ = uVar1;
    uVar1 = *(undefined4 *)(piVar21 + uVar15 + 2);
    auVar34._4_4_ = uVar1;
    auVar34._0_4_ = uVar1;
    auVar34._8_4_ = uVar1;
    auVar34._12_4_ = uVar1;
    uVar1 = *(undefined4 *)(piVar21 + uVar15 + 4);
    auVar38._4_4_ = uVar1;
    auVar38._0_4_ = uVar1;
    auVar38._8_4_ = uVar1;
    auVar38._12_4_ = uVar1;
    uVar1 = *(undefined4 *)(piVar21 + uVar15 + 6);
    auVar40._4_4_ = uVar1;
    auVar40._0_4_ = uVar1;
    auVar40._8_4_ = uVar1;
    auVar40._12_4_ = uVar1;
    auVar46._8_8_ = 0;
    auVar46._0_8_ = *(ulong *)(im_block + 8);
    auVar24 = vpunpcklwd_avx(auVar46,auVar24);
    lVar18 = 0;
    auVar49._8_4_ = 0x400;
    auVar49._0_8_ = 0x40000000400;
    auVar49._12_4_ = 0x400;
    do {
      auVar41 = auVar29;
      auVar29 = vpmaddwd_avx(auVar51,auVar28);
      auVar51 = vpinsrd_avx(ZEXT416(uVar3),*(undefined4 *)(im_block + lVar18 * 2 + 0xe),1);
      auVar35 = vpmaddwd_avx(auVar24,auVar38);
      auVar53._8_8_ = 0;
      auVar53._0_8_ = *(ulong *)(im_block + lVar18 * 2 + 0xe);
      auVar36 = vpunpcklwd_avx(auVar51,auVar53);
      auVar51 = vpmaddwd_avx(auVar41,auVar34);
      auVar51 = vpaddd_avx(auVar29,auVar51);
      uVar3 = *(uint *)(im_block + lVar18 * 2 + 0x10);
      auVar51 = vpaddd_avx(auVar51,auVar35);
      auVar51 = vpaddd_avx(auVar51,auVar49);
      auVar29 = vpmaddwd_avx(auVar36,auVar40);
      auVar51 = vpaddd_avx(auVar51,auVar29);
      auVar51 = vpsrad_avx(auVar51,0xb);
      auVar51 = vpackssdw_avx(auVar51,auVar51);
      auVar51 = vpackuswb_avx(auVar51,auVar51);
      vpextrw_avx(auVar51,0);
      vpextrw_avx(auVar51,1);
      lVar18 = lVar18 + 2;
      auVar29 = auVar24;
      auVar24 = auVar36;
      auVar51 = auVar41;
    } while (h != (int)lVar18);
  }
  else {
    uVar1 = *(undefined4 *)(piVar21 + uVar15);
    auVar58._4_4_ = uVar1;
    auVar58._0_4_ = uVar1;
    auVar58._8_4_ = uVar1;
    auVar58._12_4_ = uVar1;
    auVar58._16_4_ = uVar1;
    auVar58._20_4_ = uVar1;
    auVar58._24_4_ = uVar1;
    auVar58._28_4_ = uVar1;
    uVar1 = *(undefined4 *)(piVar21 + uVar15 + 2);
    auVar57._4_4_ = uVar1;
    auVar57._0_4_ = uVar1;
    auVar57._8_4_ = uVar1;
    auVar57._12_4_ = uVar1;
    auVar57._16_4_ = uVar1;
    auVar57._20_4_ = uVar1;
    auVar57._24_4_ = uVar1;
    auVar57._28_4_ = uVar1;
    uVar1 = *(undefined4 *)(piVar21 + uVar15 + 4);
    uVar2 = *(undefined4 *)(piVar21 + uVar15 + 6);
    if (w == 4) {
      uVar15 = *(ulong *)(im_block + 0x18);
      auVar35._8_8_ = 0;
      auVar35._0_8_ = *(ulong *)(im_block + 4);
      auVar51._8_8_ = 0;
      auVar51._0_8_ = *(ulong *)im_block;
      auVar30._0_16_ = ZEXT116(0) * auVar35 + ZEXT116(1) * auVar51;
      auVar30._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar35;
      auVar41._8_8_ = 0;
      auVar41._0_8_ = *(ulong *)(im_block + 8);
      auVar56._0_16_ = ZEXT116(0) * auVar41 + ZEXT116(1) * auVar35;
      auVar56._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar41;
      auVar30 = vpunpcklwd_avx2(auVar30,auVar56);
      auVar29._8_8_ = 0;
      auVar29._0_8_ = *(ulong *)(im_block + 0xc);
      auVar52._0_16_ = ZEXT116(0) * auVar29 + ZEXT116(1) * auVar41;
      auVar52._16_16_ = ZEXT116(1) * auVar29;
      auVar42._8_8_ = 0;
      auVar42._0_8_ = *(ulong *)(im_block + 0x10);
      auVar31._0_16_ = ZEXT116(0) * auVar42 + ZEXT116(1) * auVar29;
      auVar31._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar42;
      auVar31 = vpunpcklwd_avx2(auVar52,auVar31);
      auVar36._8_8_ = 0;
      auVar36._0_8_ = *(ulong *)(im_block + 0x14);
      auVar27._0_16_ = ZEXT116(0) * auVar36 + ZEXT116(1) * auVar42;
      auVar27._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar36;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = uVar15;
      auVar50._0_16_ = ZEXT116(0) * auVar24 + ZEXT116(1) * auVar36;
      auVar50._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar24;
      auVar56 = vpunpcklwd_avx2(auVar27,auVar50);
      lVar18 = 0;
      auVar37._8_4_ = 0x400;
      auVar37._0_8_ = 0x40000000400;
      auVar37._12_4_ = 0x400;
      auVar37._16_4_ = 0x400;
      auVar37._20_4_ = 0x400;
      auVar37._24_4_ = 0x400;
      auVar37._28_4_ = 0x400;
      do {
        auVar27 = auVar31;
        auVar43._8_8_ = 0;
        auVar43._0_8_ = *(ulong *)(im_block + lVar18 * 4 + 0x1c);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = uVar15;
        auVar48._0_16_ = ZEXT116(0) * auVar43 + ZEXT116(1) * auVar25;
        auVar48._16_16_ = ZEXT116(1) * auVar43;
        uVar15 = *(ulong *)(im_block + lVar18 * 4 + 0x20);
        auVar26._8_8_ = 0;
        auVar26._0_8_ = uVar15;
        auVar44._0_16_ = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar43;
        auVar44._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar26;
        auVar30 = vpmaddwd_avx2(auVar58,auVar30);
        auVar31 = vpmaddwd_avx2(auVar57,auVar27);
        auVar4._4_4_ = uVar1;
        auVar4._0_4_ = uVar1;
        auVar4._8_4_ = uVar1;
        auVar4._12_4_ = uVar1;
        auVar4._16_4_ = uVar1;
        auVar4._20_4_ = uVar1;
        auVar4._24_4_ = uVar1;
        auVar4._28_4_ = uVar1;
        auVar52 = vpmaddwd_avx2(auVar56,auVar4);
        auVar50 = vpunpcklwd_avx2(auVar48,auVar44);
        auVar30 = vpaddd_avx2(auVar31,auVar30);
        auVar30 = vpaddd_avx2(auVar52,auVar30);
        auVar30 = vpaddd_avx2(auVar30,auVar37);
        auVar47._4_4_ = uVar2;
        auVar47._0_4_ = uVar2;
        auVar47._8_4_ = uVar2;
        auVar47._12_4_ = uVar2;
        auVar47._16_4_ = uVar2;
        auVar47._20_4_ = uVar2;
        auVar47._24_4_ = uVar2;
        auVar47._28_4_ = uVar2;
        auVar31 = vpmaddwd_avx2(auVar50,auVar47);
        auVar30 = vpaddd_avx2(auVar30,auVar31);
        auVar30 = vpsrad_avx2(auVar30,0xb);
        auVar30 = vpackssdw_avx2(auVar30,auVar30);
        auVar30 = vpackuswb_avx2(auVar30,auVar30);
        *(int *)dst = auVar30._0_4_;
        *(int *)(dst + dst_stride) = auVar30._16_4_;
        dst = dst + dst_stride * 2;
        lVar18 = lVar18 + 2;
        auVar31 = auVar56;
        auVar30 = auVar27;
        auVar56 = auVar50;
      } while (h != (int)lVar18);
    }
    else if (w == 8) {
      auVar30 = *(undefined1 (*) [32])im_block;
      auVar31 = *(undefined1 (*) [32])(im_block + 8);
      auVar56 = *(undefined1 (*) [32])(im_block + 0x10);
      auVar52 = *(undefined1 (*) [32])(im_block + 0x18);
      auVar37 = *(undefined1 (*) [32])(im_block + 0x20);
      auVar50 = *(undefined1 (*) [32])(im_block + 0x28);
      if (subpel_y_q4 == 8) {
        pauVar19 = (undefined1 (*) [32])(im_block + 0x38);
        auVar39._8_4_ = 0x400;
        auVar39._0_8_ = 0x40000000400;
        auVar39._12_4_ = 0x400;
        auVar39._16_4_ = 0x400;
        auVar39._20_4_ = 0x400;
        auVar39._24_4_ = 0x400;
        auVar39._28_4_ = 0x400;
        do {
          auVar6 = auVar52;
          auVar5 = auVar56;
          auVar27 = *pauVar19;
          auVar56 = vpaddw_avx2(auVar27,auVar30);
          auVar52 = vpaddw_avx2(auVar50,auVar5);
          auVar47 = vpaddw_avx2(auVar37,auVar6);
          auVar30 = *(undefined1 (*) [32])(pauVar19[-1] + 0x10);
          auVar31 = vpaddw_avx2(auVar30,auVar31);
          auVar44 = vpunpcklwd_avx2(auVar56,auVar31);
          auVar48 = vpunpcklwd_avx2(auVar52,auVar47);
          auVar4 = vpunpckhwd_avx2(auVar56,auVar31);
          auVar47 = vpunpckhwd_avx2(auVar52,auVar47);
          auVar56 = vpmaddwd_avx2(auVar44,auVar58);
          auVar31 = vpmaddwd_avx2(auVar48,auVar57);
          auVar52 = vpmaddwd_avx2(auVar58,auVar4);
          auVar47 = vpmaddwd_avx2(auVar47,auVar57);
          auVar31 = vpaddd_avx2(auVar31,auVar39);
          auVar31 = vpaddd_avx2(auVar56,auVar31);
          auVar56 = vpsrad_avx2(auVar31,0xb);
          auVar31 = vpaddd_avx2(auVar47,auVar39);
          auVar31 = vpaddd_avx2(auVar31,auVar52);
          auVar31 = vpsrad_avx2(auVar31,0xb);
          auVar31 = vpackssdw_avx2(auVar56,auVar31);
          auVar31 = vpackuswb_avx2(auVar31,auVar37);
          *(long *)dst = auVar31._0_8_;
          *(long *)(dst + dst_stride) = auVar31._16_8_;
          dst = dst + dst_stride * 2;
          pauVar19 = pauVar19 + 1;
          h = h + -2;
          auVar56 = auVar37;
          auVar52 = auVar50;
          auVar50 = auVar27;
          auVar31 = auVar6;
          auVar37 = auVar30;
          auVar30 = auVar5;
        } while (h != 0);
      }
      else {
        auVar27 = vpunpcklwd_avx2(auVar30,auVar31);
        auVar47 = vpunpcklwd_avx2(auVar56,auVar52);
        auVar4 = vpunpcklwd_avx2(auVar37,auVar50);
        auVar30 = vpunpckhwd_avx2(auVar30,auVar31);
        auVar31 = vpunpckhwd_avx2(auVar56,auVar52);
        auVar56 = vpunpckhwd_avx2(auVar37,auVar50);
        pauVar19 = (undefined1 (*) [32])(im_block + 0x38);
        local_3c8._8_4_ = 0x400;
        local_3c8._0_8_ = 0x40000000400;
        local_3c8._12_4_ = 0x400;
        local_3c8._16_4_ = 0x400;
        local_3c8._20_4_ = 0x400;
        local_3c8._24_4_ = 0x400;
        local_3c8._28_4_ = 0x400;
        do {
          auVar5 = auVar47;
          auVar52 = vpmaddwd_avx2(auVar27,auVar58);
          auVar50 = vpmaddwd_avx2(auVar5,auVar57);
          auVar7._4_4_ = uVar1;
          auVar7._0_4_ = uVar1;
          auVar7._8_4_ = uVar1;
          auVar7._12_4_ = uVar1;
          auVar7._16_4_ = uVar1;
          auVar7._20_4_ = uVar1;
          auVar7._24_4_ = uVar1;
          auVar7._28_4_ = uVar1;
          auVar37 = vpmaddwd_avx2(auVar7,auVar4);
          auVar39 = vpunpcklwd_avx2(*(undefined1 (*) [32])(pauVar19[-1] + 0x10),*pauVar19);
          auVar27 = vpmaddwd_avx2(auVar58,auVar30);
          auVar47 = vpmaddwd_avx2(auVar31,auVar57);
          auVar44 = vpmaddwd_avx2(auVar7,auVar56);
          auVar48 = vpunpckhwd_avx2(*(undefined1 (*) [32])(pauVar19[-1] + 0x10),*pauVar19);
          auVar30 = vpaddd_avx2(auVar52,auVar50);
          auVar30 = vpaddd_avx2(auVar37,auVar30);
          auVar52 = vpaddd_avx2(auVar27,auVar47);
          auVar6._4_4_ = uVar2;
          auVar6._0_4_ = uVar2;
          auVar6._8_4_ = uVar2;
          auVar6._12_4_ = uVar2;
          auVar6._16_4_ = uVar2;
          auVar6._20_4_ = uVar2;
          auVar6._24_4_ = uVar2;
          auVar6._28_4_ = uVar2;
          auVar50 = vpmaddwd_avx2(auVar6,auVar39);
          auVar52 = vpaddd_avx2(auVar44,auVar52);
          auVar37 = vpmaddwd_avx2(auVar6,auVar48);
          auVar30 = vpaddd_avx2(local_3c8,auVar30);
          auVar30 = vpaddd_avx2(auVar50,auVar30);
          auVar50 = vpsrad_avx2(auVar30,0xb);
          auVar30 = vpaddd_avx2(local_3c8,auVar52);
          auVar30 = vpaddd_avx2(auVar37,auVar30);
          auVar30 = vpsrad_avx2(auVar30,0xb);
          auVar30 = vpackssdw_avx2(auVar50,auVar30);
          auVar30 = vpackuswb_avx2(auVar30,auVar56);
          *(long *)dst = auVar30._0_8_;
          *(long *)(dst + dst_stride) = auVar30._16_8_;
          dst = dst + dst_stride * 2;
          pauVar19 = pauVar19 + 1;
          h = h + -2;
          auVar47 = auVar4;
          auVar30 = auVar31;
          auVar27 = auVar5;
          auVar31 = auVar56;
          auVar56 = auVar48;
          auVar4 = auVar39;
        } while (h != 0);
      }
    }
    else if (w == 0x10) {
      auVar27 = *(undefined1 (*) [32])im_block;
      auVar30 = *(undefined1 (*) [32])(im_block + 0x10);
      auVar31 = *(undefined1 (*) [32])(im_block + 0x20);
      auVar56 = *(undefined1 (*) [32])(im_block + 0x30);
      auVar52 = *(undefined1 (*) [32])(im_block + 0x40);
      auVar37 = *(undefined1 (*) [32])(im_block + 0x50);
      auVar50 = *(undefined1 (*) [32])(im_block + 0x60);
      auVar55 = ZEXT3264(auVar50);
      if (subpel_y_q4 == 8) {
        pauVar19 = (undefined1 (*) [32])(im_block + 0x80);
        local_388._8_4_ = 0x400;
        local_388._0_8_ = 0x40000000400;
        local_388._12_4_ = 0x400;
        local_388._16_4_ = 0x400;
        local_388._20_4_ = 0x400;
        local_388._24_4_ = 0x400;
        local_388._28_4_ = 0x400;
        do {
          auVar10 = auVar56;
          auVar47 = vpaddw_avx2(auVar37,auVar31);
          auVar4 = vpaddw_avx2(auVar52,auVar37);
          auVar50 = pauVar19[-1];
          auVar56 = *pauVar19;
          auVar27 = vpaddw_avx2(auVar50,auVar27);
          auVar54 = auVar55._0_32_;
          auVar44 = vpaddw_avx2(auVar54,auVar30);
          auVar48 = vpaddw_avx2(auVar52,auVar10);
          auVar6 = vpunpcklwd_avx2(auVar27,auVar44);
          auVar7 = vpunpcklwd_avx2(auVar47,auVar48);
          auVar44 = vpunpckhwd_avx2(auVar27,auVar44);
          auVar48 = vpunpckhwd_avx2(auVar47,auVar48);
          auVar27 = vpaddw_avx2(auVar50,auVar31);
          auVar47 = vpaddw_avx2(auVar54,auVar10);
          auVar30 = vpaddw_avx2(auVar30,auVar56);
          auVar8 = vpunpcklwd_avx2(auVar30,auVar27);
          auVar39 = vpunpckhwd_avx2(auVar30,auVar27);
          auVar9 = vpunpcklwd_avx2(auVar47,auVar4);
          auVar5 = vpunpckhwd_avx2(auVar47,auVar4);
          auVar27 = vpmaddwd_avx2(auVar6,auVar58);
          auVar30 = vpmaddwd_avx2(auVar7,auVar57);
          auVar30 = vpaddd_avx2(auVar30,local_388);
          auVar30 = vpaddd_avx2(auVar27,auVar30);
          auVar47 = vpmaddwd_avx2(auVar58,auVar44);
          auVar27 = vpmaddwd_avx2(auVar48,auVar57);
          auVar27 = vpaddd_avx2(auVar27,local_388);
          auVar27 = vpaddd_avx2(auVar47,auVar27);
          auVar47 = vpsrad_avx2(auVar30,0xb);
          auVar30 = vpsrad_avx2(auVar27,0xb);
          auVar30 = vpackssdw_avx2(auVar47,auVar30);
          auVar47 = vpmaddwd_avx2(auVar58,auVar8);
          auVar27 = vpmaddwd_avx2(auVar9,auVar57);
          auVar27 = vpaddd_avx2(auVar27,local_388);
          auVar27 = vpaddd_avx2(auVar47,auVar27);
          auVar4 = vpmaddwd_avx2(auVar39,auVar58);
          auVar47 = vpmaddwd_avx2(auVar5,auVar57);
          auVar47 = vpaddd_avx2(auVar47,local_388);
          auVar47 = vpaddd_avx2(auVar47,auVar4);
          auVar27 = vpsrad_avx2(auVar27,0xb);
          auVar47 = vpsrad_avx2(auVar47,0xb);
          auVar27 = vpackssdw_avx2(auVar27,auVar47);
          auVar30 = vpackuswb_avx2(auVar30,auVar27);
          auVar30 = vpermq_avx2(auVar30,0xd8);
          *(undefined1 (*) [16])dst = auVar30._0_16_;
          *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar30._16_16_;
          dst = *(undefined1 (*) [16])dst + dst_stride * 2;
          pauVar19 = pauVar19 + 2;
          auVar55 = ZEXT3264(auVar56);
          h = h + -2;
          auVar27 = auVar31;
          auVar31 = auVar52;
          auVar56 = auVar37;
          auVar52 = auVar54;
          auVar30 = auVar10;
          auVar37 = auVar50;
        } while (h != 0);
      }
      else {
        auVar44 = vpunpcklwd_avx2(auVar27,auVar30);
        local_368 = vpunpcklwd_avx2(auVar31,auVar56);
        local_388 = vpunpcklwd_avx2(auVar52,auVar37);
        auVar27 = vpunpckhwd_avx2(auVar27,auVar30);
        auVar47 = vpunpckhwd_avx2(auVar31,auVar56);
        auVar4 = vpunpckhwd_avx2(auVar52,auVar37);
        auVar48 = vpunpcklwd_avx2(auVar30,auVar31);
        local_3c8 = vpunpcklwd_avx2(auVar56,auVar52);
        auVar39 = vpunpcklwd_avx2(auVar37,auVar50);
        auVar30 = vpunpckhwd_avx2(auVar30,auVar31);
        auVar31 = vpunpckhwd_avx2(auVar56,auVar52);
        auVar56 = vpunpckhwd_avx2(auVar37,auVar50);
        pauVar19 = (undefined1 (*) [32])(im_block + 0x80);
        local_2d8._8_4_ = 0x400;
        local_2d8._0_8_ = 0x40000000400;
        local_2d8._12_4_ = 0x400;
        local_2d8._16_4_ = 0x400;
        local_2d8._20_4_ = 0x400;
        local_2d8._24_4_ = 0x400;
        local_2d8._28_4_ = 0x400;
        do {
          auVar7 = auVar39;
          auVar5 = auVar56;
          auVar8 = auVar47;
          auVar54 = local_368;
          auVar50 = vpmaddwd_avx2(auVar48,auVar58);
          auVar37 = vpmaddwd_avx2(local_3c8,auVar57);
          auVar47 = vpmaddwd_avx2(auVar30,auVar58);
          auVar48 = vpmaddwd_avx2(auVar31,auVar57);
          auVar30 = vpmaddwd_avx2(auVar44,auVar58);
          auVar56 = vpmaddwd_avx2(local_368,auVar57);
          local_368 = local_388;
          auVar52 = vpmaddwd_avx2(auVar27,auVar58);
          auVar30 = vpaddd_avx2(auVar30,auVar56);
          auVar10._4_4_ = uVar1;
          auVar10._0_4_ = uVar1;
          auVar10._8_4_ = uVar1;
          auVar10._12_4_ = uVar1;
          auVar10._16_4_ = uVar1;
          auVar10._20_4_ = uVar1;
          auVar10._24_4_ = uVar1;
          auVar10._28_4_ = uVar1;
          auVar56 = vpmaddwd_avx2(local_388,auVar10);
          auVar56 = vpaddd_avx2(auVar30,auVar56);
          auVar30 = vpmaddwd_avx2(auVar8,auVar57);
          auVar30 = vpaddd_avx2(auVar30,auVar52);
          auVar52 = vpmaddwd_avx2(auVar4,auVar10);
          auVar52 = vpaddd_avx2(auVar30,auVar52);
          auVar30 = pauVar19[-1];
          auVar50 = vpaddd_avx2(auVar50,auVar37);
          auVar37 = vpmaddwd_avx2(auVar7,auVar10);
          auVar50 = vpaddd_avx2(auVar50,auVar37);
          local_388 = vpunpcklwd_avx2(auVar55._0_32_,auVar30);
          auVar6 = vpunpckhwd_avx2(auVar55._0_32_,auVar30);
          auVar37 = vpaddd_avx2(auVar47,auVar48);
          auVar27 = vpmaddwd_avx2(auVar5,auVar10);
          auVar37 = vpaddd_avx2(auVar37,auVar27);
          auVar9._4_4_ = uVar2;
          auVar9._0_4_ = uVar2;
          auVar9._8_4_ = uVar2;
          auVar9._12_4_ = uVar2;
          auVar9._16_4_ = uVar2;
          auVar9._20_4_ = uVar2;
          auVar9._24_4_ = uVar2;
          auVar9._28_4_ = uVar2;
          auVar27 = vpmaddwd_avx2(local_388,auVar9);
          auVar56 = vpaddd_avx2(local_2d8,auVar56);
          auVar27 = vpaddd_avx2(auVar56,auVar27);
          auVar47 = vpmaddwd_avx2(auVar6,auVar9);
          auVar56 = vpaddd_avx2(auVar52,local_2d8);
          auVar52 = vpaddd_avx2(auVar56,auVar47);
          auVar56 = *pauVar19;
          auVar55 = ZEXT3264(auVar56);
          auVar27 = vpsrad_avx2(auVar27,0xb);
          auVar52 = vpsrad_avx2(auVar52,0xb);
          auVar52 = vpackssdw_avx2(auVar27,auVar52);
          auVar39 = vpunpcklwd_avx2(auVar30,auVar56);
          auVar50 = vpaddd_avx2(auVar50,local_2d8);
          auVar27 = vpmaddwd_avx2(auVar39,auVar9);
          auVar50 = vpaddd_avx2(auVar50,auVar27);
          auVar56 = vpunpckhwd_avx2(auVar30,auVar56);
          auVar30 = vpaddd_avx2(local_2d8,auVar37);
          auVar37 = vpmaddwd_avx2(auVar56,auVar9);
          auVar30 = vpaddd_avx2(auVar30,auVar37);
          auVar50 = vpsrad_avx2(auVar50,0xb);
          auVar30 = vpsrad_avx2(auVar30,0xb);
          auVar30 = vpackssdw_avx2(auVar50,auVar30);
          auVar30 = vpackuswb_avx2(auVar52,auVar30);
          auVar30 = vpermq_avx2(auVar30,0xd8);
          *(undefined1 (*) [16])dst = auVar30._0_16_;
          *(undefined1 (*) [16])(*(undefined1 (*) [16])dst + dst_stride) = auVar30._16_16_;
          dst = *(undefined1 (*) [16])dst + dst_stride * 2;
          pauVar19 = pauVar19 + 2;
          h = h + -2;
          auVar44 = auVar54;
          auVar47 = auVar4;
          auVar27 = auVar8;
          auVar30 = auVar31;
          auVar48 = local_3c8;
          auVar4 = auVar6;
          auVar31 = auVar5;
          local_3c8 = auVar7;
        } while (h != 0);
      }
    }
    else {
      lVar18 = (long)w;
      piVar21 = im_block + lVar18 * 8 + 0x10;
      piVar22 = im_block + lVar18 * 7 + 0x10;
      lVar20 = 0;
      auVar5._4_4_ = uVar2;
      auVar5._0_4_ = uVar2;
      auVar5._8_4_ = uVar2;
      auVar5._12_4_ = uVar2;
      auVar5._16_4_ = uVar2;
      auVar5._20_4_ = uVar2;
      auVar5._24_4_ = uVar2;
      auVar5._28_4_ = uVar2;
      do {
        pauVar19 = (undefined1 (*) [32])(dst + lVar20);
        auVar27 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18 * 6);
        auVar30 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18);
        auVar31 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18 + 0x10);
        auVar4 = vpunpcklwd_avx2(*(undefined1 (*) [32])(im_block + lVar20),auVar30);
        auVar56 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18 * 2);
        auVar52 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18 * 3);
        local_3c8 = vpunpcklwd_avx2(auVar56,auVar52);
        auVar50 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18 * 4);
        auVar37 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18 * 5);
        local_2f8 = vpunpcklwd_avx2(auVar50,auVar37);
        auVar47 = vpunpckhwd_avx2(*(undefined1 (*) [32])(im_block + lVar20),auVar30);
        local_368 = vpunpckhwd_avx2(auVar56,auVar52);
        local_198 = vpunpckhwd_avx2(auVar50,auVar37);
        auVar44 = vpunpcklwd_avx2(auVar30,auVar56);
        local_388 = vpunpcklwd_avx2(auVar52,auVar50);
        auVar56 = vpunpckhwd_avx2(auVar30,auVar56);
        auVar48 = vpunpcklwd_avx2(auVar37,auVar27);
        local_278 = vpunpckhwd_avx2(auVar52,auVar50);
        auVar52 = vpunpckhwd_avx2(auVar37,auVar27);
        auVar50 = vpunpcklwd_avx2(*(undefined1 (*) [32])(im_block + lVar20 + 0x10),auVar31);
        local_1f8 = vpunpckhwd_avx2(*(undefined1 (*) [32])(im_block + lVar20 + 0x10),auVar31);
        auVar30 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18 * 2 + 0x10);
        local_238 = vpunpcklwd_avx2(auVar31,auVar30);
        local_218 = vpunpckhwd_avx2(auVar31,auVar30);
        auVar31 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18 * 3 + 0x10);
        local_298 = vpunpcklwd_avx2(auVar30,auVar31);
        local_2b8 = vpunpckhwd_avx2(auVar30,auVar31);
        auVar30 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18 * 4 + 0x10);
        local_2d8 = vpunpcklwd_avx2(auVar31,auVar30);
        local_178 = vpunpckhwd_avx2(auVar31,auVar30);
        auVar31 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18 * 5 + 0x10);
        local_1d8 = vpunpcklwd_avx2(auVar30,auVar31);
        local_1b8 = vpunpckhwd_avx2(auVar30,auVar31);
        auVar30 = *(undefined1 (*) [32])(im_block + lVar20 + lVar18 * 6 + 0x10);
        auVar37 = vpunpcklwd_avx2(auVar31,auVar30);
        auVar31 = vpunpckhwd_avx2(auVar31,auVar30);
        lVar17 = 0;
        auVar8._8_4_ = 0x400;
        auVar8._0_8_ = 0x40000000400;
        auVar8._12_4_ = 0x400;
        auVar8._16_4_ = 0x400;
        auVar8._20_4_ = 0x400;
        auVar8._24_4_ = 0x400;
        auVar8._28_4_ = 0x400;
        iVar16 = h;
        do {
          auVar6 = auVar31;
          auVar9 = auVar37;
          auVar7 = auVar52;
          auVar10 = auVar48;
          auVar14 = local_298;
          auVar13 = local_2b8;
          auVar12 = local_368;
          auVar11 = local_3c8;
          auVar31 = vpmaddwd_avx2(auVar58,auVar4);
          auVar52 = vpmaddwd_avx2(local_3c8,auVar57);
          auVar31 = vpaddd_avx2(auVar52,auVar31);
          local_3c8 = local_2f8;
          auVar54._4_4_ = uVar1;
          auVar54._0_4_ = uVar1;
          auVar54._8_4_ = uVar1;
          auVar54._12_4_ = uVar1;
          auVar54._16_4_ = uVar1;
          auVar54._20_4_ = uVar1;
          auVar54._24_4_ = uVar1;
          auVar54._28_4_ = uVar1;
          auVar52 = vpmaddwd_avx2(local_2f8,auVar54);
          auVar31 = vpaddd_avx2(auVar52,auVar31);
          auVar52 = vpmaddwd_avx2(auVar58,auVar47);
          auVar37 = vpmaddwd_avx2(local_368,auVar57);
          auVar52 = vpaddd_avx2(auVar52,auVar37);
          local_368 = local_198;
          auVar37 = vpmaddwd_avx2(local_198,auVar54);
          auVar52 = vpaddd_avx2(auVar52,auVar37);
          auVar37 = vpmaddwd_avx2(auVar44,auVar58);
          auVar47 = vpmaddwd_avx2(local_388,auVar57);
          auVar37 = vpaddd_avx2(auVar47,auVar37);
          auVar47 = vpmaddwd_avx2(auVar10,auVar54);
          auVar37 = vpaddd_avx2(auVar47,auVar37);
          auVar56 = vpmaddwd_avx2(auVar58,auVar56);
          auVar47 = vpmaddwd_avx2(local_278,auVar57);
          auVar56 = vpaddd_avx2(auVar56,auVar47);
          auVar47 = vpmaddwd_avx2(auVar7,auVar54);
          auVar47 = vpaddd_avx2(auVar56,auVar47);
          auVar56 = vpmaddwd_avx2(auVar50,auVar58);
          auVar50 = vpmaddwd_avx2(local_298,auVar57);
          auVar56 = vpaddd_avx2(auVar50,auVar56);
          local_298 = local_1d8;
          auVar50 = vpmaddwd_avx2(local_1d8,auVar54);
          auVar56 = vpaddd_avx2(auVar50,auVar56);
          auVar50 = vpmaddwd_avx2(auVar58,local_1f8);
          auVar4 = vpmaddwd_avx2(local_2b8,auVar57);
          auVar50 = vpaddd_avx2(auVar50,auVar4);
          local_2b8 = local_1b8;
          auVar4 = vpmaddwd_avx2(local_1b8,auVar54);
          auVar50 = vpaddd_avx2(auVar50,auVar4);
          auVar4 = vpmaddwd_avx2(auVar58,local_238);
          local_238 = local_2d8;
          auVar44 = vpmaddwd_avx2(local_2d8,auVar57);
          auVar4 = vpaddd_avx2(auVar4,auVar44);
          auVar44 = vpmaddwd_avx2(auVar9,auVar54);
          auVar4 = vpaddd_avx2(auVar4,auVar44);
          auVar44 = vpmaddwd_avx2(auVar58,local_218);
          auVar48 = vpmaddwd_avx2(local_178,auVar57);
          auVar44 = vpaddd_avx2(auVar44,auVar48);
          auVar48 = vpmaddwd_avx2(auVar6,auVar54);
          auVar44 = vpaddd_avx2(auVar44,auVar48);
          auVar48 = vpaddd_avx2(auVar8,auVar31);
          auVar31 = *(undefined1 (*) [32])((long)piVar22 + lVar17 + -0x20);
          local_2f8 = vpunpcklwd_avx2(auVar27,auVar31);
          auVar39 = vpmaddwd_avx2(local_2f8,auVar5);
          auVar48 = vpaddd_avx2(auVar48,auVar39);
          local_198 = vpunpckhwd_avx2(auVar27,auVar31);
          auVar52 = vpaddd_avx2(auVar52,auVar8);
          auVar27 = vpmaddwd_avx2(local_198,auVar5);
          auVar52 = vpaddd_avx2(auVar52,auVar27);
          auVar27 = vpsrad_avx2(auVar48,0xb);
          auVar52 = vpsrad_avx2(auVar52,0xb);
          auVar52 = vpackssdw_avx2(auVar27,auVar52);
          auVar27 = vpaddd_avx2(auVar56,auVar8);
          auVar56 = *(undefined1 (*) [32])((long)piVar22 + lVar17);
          local_1d8 = vpunpcklwd_avx2(auVar30,auVar56);
          auVar48 = vpmaddwd_avx2(local_1d8,auVar5);
          auVar27 = vpaddd_avx2(auVar48,auVar27);
          local_1b8 = vpunpckhwd_avx2(auVar30,auVar56);
          auVar30 = vpaddd_avx2(auVar50,auVar8);
          auVar50 = vpmaddwd_avx2(local_1b8,auVar5);
          auVar30 = vpaddd_avx2(auVar50,auVar30);
          auVar50 = vpsrad_avx2(auVar27,0xb);
          auVar30 = vpsrad_avx2(auVar30,0xb);
          auVar30 = vpackssdw_avx2(auVar50,auVar30);
          auVar52 = vpackuswb_avx2(auVar52,auVar30);
          auVar27 = *(undefined1 (*) [32])((long)piVar21 + lVar17 + -0x20);
          auVar30 = *(undefined1 (*) [32])((long)piVar21 + lVar17);
          *pauVar19 = auVar52;
          auVar52 = vpaddd_avx2(auVar8,auVar37);
          auVar48 = vpunpcklwd_avx2(auVar31,auVar27);
          auVar50 = vpmaddwd_avx2(auVar48,auVar5);
          auVar50 = vpaddd_avx2(auVar50,auVar52);
          auVar52 = vpunpckhwd_avx2(auVar31,auVar27);
          auVar31 = vpaddd_avx2(auVar47,auVar8);
          auVar37 = vpmaddwd_avx2(auVar52,auVar5);
          auVar31 = vpaddd_avx2(auVar37,auVar31);
          auVar50 = vpsrad_avx2(auVar50,0xb);
          auVar31 = vpsrad_avx2(auVar31,0xb);
          auVar50 = vpackssdw_avx2(auVar50,auVar31);
          auVar31 = vpaddd_avx2(auVar4,auVar8);
          auVar37 = vpunpcklwd_avx2(auVar56,auVar30);
          auVar47 = vpmaddwd_avx2(auVar37,auVar5);
          auVar47 = vpaddd_avx2(auVar47,auVar31);
          auVar31 = vpunpckhwd_avx2(auVar56,auVar30);
          auVar56 = vpaddd_avx2(auVar44,auVar8);
          auVar4 = vpmaddwd_avx2(auVar31,auVar5);
          auVar56 = vpaddd_avx2(auVar56,auVar4);
          auVar47 = vpsrad_avx2(auVar47,0xb);
          auVar56 = vpsrad_avx2(auVar56,0xb);
          auVar56 = vpackssdw_avx2(auVar47,auVar56);
          auVar56 = vpackuswb_avx2(auVar50,auVar56);
          *(undefined1 (*) [32])(*pauVar19 + dst_stride) = auVar56;
          local_1f8 = auVar13;
          local_218 = local_178;
          pauVar19 = (undefined1 (*) [32])(*pauVar19 + dst_stride * 2);
          lVar17 = lVar17 + (long)(w * 2) * 2;
          iVar16 = iVar16 + -2;
          auVar56 = local_278;
          auVar47 = auVar12;
          auVar4 = auVar11;
          auVar50 = auVar14;
          auVar44 = local_388;
          local_388 = auVar10;
          local_2d8 = auVar9;
          local_278 = auVar7;
          local_178 = auVar6;
        } while (iVar16 != 0);
        lVar20 = lVar20 + 0x20;
        piVar21 = piVar21 + 0x20;
        piVar22 = piVar22 + 0x20;
      } while (lVar20 < lVar18);
    }
  }
  return;
}

Assistant:

static void convolve_2d_sr_ver_8tap_avx2(
    const int16_t *const im_block, const int32_t w, const int32_t h,
    const InterpFilterParams *const filter_params_y, const int32_t subpel_y_q4,
    uint8_t *dst, const int32_t dst_stride) {
  const int16_t *im = im_block;
  int32_t y;

  if (w == 2) {
    __m128i coeffs_128[4], s_32[8], ss_128[4];

    prepare_coeffs_8tap_sse2(filter_params_y, subpel_y_q4, coeffs_128);

    s_32[0] = _mm_cvtsi32_si128(*(int32_t *)(im + 0 * 2));
    s_32[1] = _mm_cvtsi32_si128(*(int32_t *)(im + 1 * 2));
    s_32[2] = _mm_cvtsi32_si128(*(int32_t *)(im + 2 * 2));
    s_32[3] = _mm_cvtsi32_si128(*(int32_t *)(im + 3 * 2));
    s_32[4] = _mm_cvtsi32_si128(*(int32_t *)(im + 4 * 2));
    s_32[5] = _mm_cvtsi32_si128(*(int32_t *)(im + 5 * 2));
    s_32[6] = _mm_cvtsi32_si128(*(int32_t *)(im + 6 * 2));

    const __m128i src01 = _mm_unpacklo_epi32(s_32[0], s_32[1]);
    const __m128i src12 = _mm_unpacklo_epi32(s_32[1], s_32[2]);
    const __m128i src23 = _mm_unpacklo_epi32(s_32[2], s_32[3]);
    const __m128i src34 = _mm_unpacklo_epi32(s_32[3], s_32[4]);
    const __m128i src45 = _mm_unpacklo_epi32(s_32[4], s_32[5]);
    const __m128i src56 = _mm_unpacklo_epi32(s_32[5], s_32[6]);

    ss_128[0] = _mm_unpacklo_epi16(src01, src12);
    ss_128[1] = _mm_unpacklo_epi16(src23, src34);
    ss_128[2] = _mm_unpacklo_epi16(src45, src56);

    y = h;
    do {
      const __m128i res =
          xy_y_convolve_8tap_2x2_sse2(im, s_32, ss_128, coeffs_128);
      xy_y_round_store_2x2_sse2(res, dst, dst_stride);
      im += 2 * 2;
      dst += 2 * dst_stride;
      y -= 2;
    } while (y);
  } else {
    __m256i coeffs_256[4];

    prepare_coeffs_8tap_avx2(filter_params_y, subpel_y_q4, coeffs_256);

    if (w == 4) {
      __m128i s_64[8];
      __m256i s_256[8], ss_256[4];

      s_64[0] = _mm_loadl_epi64((__m128i *)(im + 0 * 4));
      s_64[1] = _mm_loadl_epi64((__m128i *)(im + 1 * 4));
      s_64[2] = _mm_loadl_epi64((__m128i *)(im + 2 * 4));
      s_64[3] = _mm_loadl_epi64((__m128i *)(im + 3 * 4));
      s_64[4] = _mm_loadl_epi64((__m128i *)(im + 4 * 4));
      s_64[5] = _mm_loadl_epi64((__m128i *)(im + 5 * 4));
      s_64[6] = _mm_loadl_epi64((__m128i *)(im + 6 * 4));

      // Load lines a and b. Line a to lower 128, line b to upper 128
      s_256[0] = _mm256_setr_m128i(s_64[0], s_64[1]);
      s_256[1] = _mm256_setr_m128i(s_64[1], s_64[2]);
      s_256[2] = _mm256_setr_m128i(s_64[2], s_64[3]);
      s_256[3] = _mm256_setr_m128i(s_64[3], s_64[4]);
      s_256[4] = _mm256_setr_m128i(s_64[4], s_64[5]);
      s_256[5] = _mm256_setr_m128i(s_64[5], s_64[6]);

      ss_256[0] = _mm256_unpacklo_epi16(s_256[0], s_256[1]);
      ss_256[1] = _mm256_unpacklo_epi16(s_256[2], s_256[3]);
      ss_256[2] = _mm256_unpacklo_epi16(s_256[4], s_256[5]);

      y = h;
      do {
        const __m256i res =
            xy_y_convolve_8tap_4x2_avx2(im, s_64, ss_256, coeffs_256);
        xy_y_round_store_4x2_avx2(res, dst, dst_stride);
        im += 2 * 4;
        dst += 2 * dst_stride;
        y -= 2;
      } while (y);
    } else if (w == 8) {
      __m256i s_256[8], r[2];

      s_256[0] = _mm256_loadu_si256((__m256i *)(im + 0 * 8));
      s_256[1] = _mm256_loadu_si256((__m256i *)(im + 1 * 8));
      s_256[2] = _mm256_loadu_si256((__m256i *)(im + 2 * 8));
      s_256[3] = _mm256_loadu_si256((__m256i *)(im + 3 * 8));
      s_256[4] = _mm256_loadu_si256((__m256i *)(im + 4 * 8));
      s_256[5] = _mm256_loadu_si256((__m256i *)(im + 5 * 8));
      y = h;

      if (subpel_y_q4 != 8) {
        __m256i ss_256[8];

        convolve_8tap_unpack_avx2(s_256, ss_256);

        do {
          xy_y_convolve_8tap_8x2_avx2(im, ss_256, coeffs_256, r);
          xy_y_round_store_8x2_avx2(r, dst, dst_stride);
          im += 2 * 8;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      } else {
        do {
          xy_y_convolve_8tap_8x2_half_pel_avx2(im, coeffs_256, s_256, r);
          xy_y_round_store_8x2_avx2(r, dst, dst_stride);
          im += 2 * 8;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      }
    } else if (w == 16) {
      __m256i s_256[8], r[4];

      load_16bit_7rows_avx2(im, 16, s_256);
      y = h;

      if (subpel_y_q4 != 8) {
        __m256i ss_256[8], tt_256[8];

        convolve_8tap_unpack_avx2(s_256, ss_256);
        convolve_8tap_unpack_avx2(s_256 + 1, tt_256);

        do {
          xy_y_convolve_8tap_16x2_avx2(im, 16, coeffs_256, s_256, ss_256,
                                       tt_256, r);
          xy_y_round_store_16x2_avx2(r, dst, dst_stride);

          im += 2 * 16;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      } else {
        do {
          xy_y_convolve_8tap_16x2_half_pel_avx2(im, 16, coeffs_256, s_256, r);
          xy_y_round_store_16x2_avx2(r, dst, dst_stride);

          im += 2 * 16;
          dst += 2 * dst_stride;
          y -= 2;
        } while (y);
      }
    } else {
      int32_t x = 0;
      __m256i s_256[2][8], r0[4], r1[4];

      assert(!(w % 32));

      __m256i ss_256[2][8], tt_256[2][8];

      do {
        const int16_t *s = im + x;
        uint8_t *d = dst + x;

        load_16bit_7rows_avx2(s, w, s_256[0]);
        convolve_8tap_unpack_avx2(s_256[0], ss_256[0]);
        convolve_8tap_unpack_avx2(s_256[0] + 1, tt_256[0]);

        load_16bit_7rows_avx2(s + 16, w, s_256[1]);
        convolve_8tap_unpack_avx2(s_256[1], ss_256[1]);
        convolve_8tap_unpack_avx2(s_256[1] + 1, tt_256[1]);

        y = h;
        do {
          xy_y_convolve_8tap_16x2_avx2(s, w, coeffs_256, s_256[0], ss_256[0],
                                       tt_256[0], r0);
          xy_y_convolve_8tap_16x2_avx2(s + 16, w, coeffs_256, s_256[1],
                                       ss_256[1], tt_256[1], r1);
          xy_y_round_store_32_avx2(r0 + 0, r1 + 0, d);
          xy_y_round_store_32_avx2(r0 + 2, r1 + 2, d + dst_stride);

          s += 2 * w;
          d += 2 * dst_stride;
          y -= 2;
        } while (y);

        x += 32;
      } while (x < w);
    }
  }
}